

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5Fts5Func(sqlite3_context *pCtx,int nArg,sqlite3_value **apArg)

{
  char *zPType;
  undefined8 *puVar1;
  sqlite3_value *in_RDX;
  sqlite3_context *in_RDI;
  fts5_api **ppApi;
  Fts5Global *pGlobal;
  
  zPType = (char *)sqlite3_user_data(in_RDI);
  puVar1 = (undefined8 *)sqlite3_value_pointer(in_RDX,zPType);
  if (puVar1 != (undefined8 *)0x0) {
    *puVar1 = zPType;
  }
  return;
}

Assistant:

static void fts5Fts5Func(
  sqlite3_context *pCtx,          /* Function call context */
  int nArg,                       /* Number of args */
  sqlite3_value **apArg           /* Function arguments */
){
  Fts5Global *pGlobal = (Fts5Global*)sqlite3_user_data(pCtx);
  fts5_api **ppApi;
  UNUSED_PARAM(nArg);
  assert( nArg==1 );
  ppApi = (fts5_api**)sqlite3_value_pointer(apArg[0], "fts5_api_ptr");
  if( ppApi ) *ppApi = &pGlobal->api;
}